

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<float,float,float,duckdb::BothInclusiveBetweenOperator,true>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  float local_7c;
  float local_78;
  float local_74;
  SelectionVector *local_70;
  data_ptr_t local_68;
  SelectionVector *local_60;
  data_ptr_t local_58;
  SelectionVector *local_50;
  data_ptr_t local_48;
  SelectionVector *local_40;
  SelectionVector *local_38;
  
  local_40 = adata->sel;
  local_48 = adata->data;
  local_50 = bdata->sel;
  local_58 = bdata->data;
  local_60 = cdata->sel;
  local_68 = cdata->data;
  local_70 = true_sel;
  local_38 = sel;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      lVar5 = 0;
      if (count != 0) {
        uVar7 = 0;
        local_70 = (SelectionVector *)0x0;
        do {
          uVar8 = uVar7;
          if (local_38->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)local_38->sel_vector[uVar7];
          }
          uVar3 = uVar7;
          if (local_40->sel_vector != (sel_t *)0x0) {
            uVar3 = (ulong)local_40->sel_vector[uVar7];
          }
          uVar2 = uVar7;
          if (local_50->sel_vector != (sel_t *)0x0) {
            uVar2 = (ulong)local_50->sel_vector[uVar7];
          }
          uVar4 = uVar7;
          if (local_60->sel_vector != (sel_t *)0x0) {
            uVar4 = (ulong)local_60->sel_vector[uVar7];
          }
          local_7c = *(float *)(local_48 + uVar3 * 4);
          local_74 = *(float *)(local_58 + uVar2 * 4);
          local_78 = *(float *)(local_68 + uVar4 * 4);
          bVar1 = GreaterThanEquals::Operation<float>(&local_7c,&local_74);
          uVar3 = 1;
          if (bVar1) {
            bVar1 = GreaterThan::Operation<float>(&local_7c,&local_78);
            uVar3 = (ulong)bVar1;
          }
          false_sel->sel_vector[lVar5] = (sel_t)uVar8;
          lVar5 = lVar5 + uVar3;
          uVar7 = uVar7 + 1;
        } while (count != uVar7);
      }
      return count - lVar5;
    }
    if (count != 0) {
      iVar6 = 0;
      uVar7 = 0;
      do {
        uVar8 = uVar7;
        if (local_38->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)local_38->sel_vector[uVar7];
        }
        uVar3 = uVar7;
        if (local_40->sel_vector != (sel_t *)0x0) {
          uVar3 = (ulong)local_40->sel_vector[uVar7];
        }
        uVar2 = uVar7;
        if (local_50->sel_vector != (sel_t *)0x0) {
          uVar2 = (ulong)local_50->sel_vector[uVar7];
        }
        uVar4 = uVar7;
        if (local_60->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)local_60->sel_vector[uVar7];
        }
        local_7c = *(float *)(local_48 + uVar3 * 4);
        local_74 = *(float *)(local_58 + uVar2 * 4);
        local_78 = *(float *)(local_68 + uVar4 * 4);
        bVar1 = GreaterThanEquals::Operation<float>(&local_7c,&local_74);
        if (bVar1) {
          bVar1 = GreaterThan::Operation<float>(&local_7c,&local_78);
          uVar3 = (ulong)!bVar1;
        }
        else {
          uVar3 = 0;
        }
        local_70->sel_vector[iVar6] = (sel_t)uVar8;
        iVar6 = iVar6 + uVar3;
        uVar7 = uVar7 + 1;
      } while (count != uVar7);
      return iVar6;
    }
  }
  else if (count != 0) {
    iVar6 = 0;
    lVar5 = 0;
    uVar7 = 0;
    do {
      uVar8 = uVar7;
      if (local_38->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)local_38->sel_vector[uVar7];
      }
      uVar3 = uVar7;
      if (local_40->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)local_40->sel_vector[uVar7];
      }
      uVar2 = uVar7;
      if (local_50->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)local_50->sel_vector[uVar7];
      }
      uVar4 = uVar7;
      if (local_60->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)local_60->sel_vector[uVar7];
      }
      local_7c = *(float *)(local_48 + uVar3 * 4);
      local_74 = *(float *)(local_58 + uVar2 * 4);
      local_78 = *(float *)(local_68 + uVar4 * 4);
      bVar1 = GreaterThanEquals::Operation<float>(&local_7c,&local_74);
      if (bVar1) {
        bVar1 = GreaterThan::Operation<float>(&local_7c,&local_78);
        bVar1 = !bVar1;
      }
      else {
        bVar1 = false;
      }
      local_70->sel_vector[iVar6] = (sel_t)uVar8;
      iVar6 = iVar6 + bVar1;
      false_sel->sel_vector[lVar5] = (sel_t)uVar8;
      lVar5 = lVar5 + (ulong)(bVar1 ^ 1);
      uVar7 = uVar7 + 1;
    } while (count != uVar7);
    return iVar6;
  }
  return 0;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}